

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

bool __thiscall Container::is_oom_killed(Container *this)

{
  CgroupController *pCVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  ContextManager *pCVar5;
  size_t in_RCX;
  allocator<char> local_299;
  string local_298 [32];
  undefined1 local_278 [8];
  string val;
  string name;
  string local_230 [32];
  undefined1 local_210 [40];
  stringstream sstream;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  string data;
  Container *this_local;
  
  pCVar1 = this->memory_controller_;
  data.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"memory.oom_control",&local_51);
  CgroupController::read((CgroupController *)local_30,(int)pCVar1,local_50,in_RCX);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  pCVar1 = this->memory_controller_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"memory.oom_control",(allocator<char> *)(name.field_2._M_local_buf + 0xf));
  CgroupController::read((CgroupController *)local_210,(int)pCVar1,local_230,in_RCX);
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(local_210 + 0x20),(string *)local_210,_Var3);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_278);
  do {
    piVar4 = std::operator>>((istream *)(local_210 + 0x20),(string *)(val.field_2._M_local_buf + 8))
    ;
    piVar4 = std::operator>>(piVar4,(string *)local_278);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) {
      pCVar5 = ContextManager::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_298,"Can\'t find oom_kill field in memory.oom_control",&local_299);
      (**pCVar5->_vptr_ContextManager)(pCVar5,local_298);
      std::__cxx11::string::~string(local_298);
      std::allocator<char>::~allocator(&local_299);
      _exit(-1);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&val.field_2 + 8),"oom_kill");
  } while (!bVar2);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_278,"0");
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_210 + 0x20));
  std::__cxx11::string::~string((string *)local_30);
  return bVar2;
}

Assistant:

bool Container::is_oom_killed() {
    std::string data = memory_controller_->read("memory.oom_control");
    std::stringstream sstream(memory_controller_->read("memory.oom_control"));
    std::string name, val;
    while (sstream >> name >> val) {
        if (name == "oom_kill") {
            return (val != "0");
        }
    }
    die("Can't find oom_kill field in memory.oom_control");
    _exit(-1); // we should not get here
}